

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianPuffRecord.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::GaussianPuffRecord::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GaussianPuffRecord *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_2a0;
  KString local_280;
  KString local_260;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  EnvironmentRecord::GetAsString_abi_cxx11_(&local_1c0,&this->super_EnvironmentRecord);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tPuff Location:        ");
  WorldCoordinates::GetAsString_abi_cxx11_(&local_1e0,&this->m_PuffLocation);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\tOrigination Location: ");
  WorldCoordinates::GetAsString_abi_cxx11_(&local_200,&this->m_OrigLocation);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"\tSigma:                ");
  Vector::GetAsString_abi_cxx11_(&local_220,&this->m_Sigma);
  poVar1 = std::operator<<(poVar1,(string *)&local_220);
  poVar1 = std::operator<<(poVar1,"\td(Sigma)/dt:          ");
  Vector::GetAsString_abi_cxx11_(&local_240,&this->m_DDTSigma);
  poVar1 = std::operator<<(poVar1,(string *)&local_240);
  poVar1 = std::operator<<(poVar1,"\tOrientation:          ");
  EulerAngles::GetAsString_abi_cxx11_(&local_260,&this->m_Ori);
  poVar1 = std::operator<<(poVar1,(string *)&local_260);
  poVar1 = std::operator<<(poVar1,"\tVelocity:             ");
  Vector::GetAsString_abi_cxx11_(&local_280,&this->m_Velocity);
  poVar1 = std::operator<<(poVar1,(string *)&local_280);
  poVar1 = std::operator<<(poVar1,"\tAngualr Velocity:     ");
  Vector::GetAsString_abi_cxx11_(&local_2a0,&this->m_AngularVelocity);
  poVar1 = std::operator<<(poVar1,(string *)&local_2a0);
  poVar1 = std::operator<<(poVar1,"\tCentroid Height:      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32CentHeight);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString GaussianPuffRecord::GetAsString() const
{
    KStringStream ss;

    ss << EnvironmentRecord::GetAsString()
       << "\tPuff Location:        " << m_PuffLocation.GetAsString()
       << "\tOrigination Location: " << m_OrigLocation.GetAsString()
       << "\tSigma:                " << m_Sigma.GetAsString()
       << "\td(Sigma)/dt:          " << m_DDTSigma.GetAsString()
       << "\tOrientation:          " << m_Ori.GetAsString()
       << "\tVelocity:             " << m_Velocity.GetAsString()
       << "\tAngualr Velocity:     " << m_AngularVelocity.GetAsString()
       << "\tCentroid Height:      " << m_f32CentHeight << "\n";

    return ss.str();
}